

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Int.cpp
# Opt level: O0

uint32_t IntToHex_GetLength(int64_t a)

{
  ulong uVar1;
  bool local_29;
  uint64_t most_significant;
  ulong uStack_18;
  uint32_t len;
  uint64_t b;
  int64_t a_local;
  
  most_significant._4_4_ = 0;
  uVar1 = a;
  do {
    uStack_18 = uVar1;
    most_significant._4_4_ = most_significant._4_4_ + 1;
    uVar1 = uStack_18 >> 4;
  } while (uStack_18 >> 4 != 0);
  local_29 = a < 0 && uStack_18 < 8;
  return most_significant._4_4_ + (uint)local_29;
}

Assistant:

uint32_t IntToHex_GetLength (int64_t a)
{
    // If negative and first digit is <8, add one to induce leading 8-F
    // so that sign extension of most significant bit will work.
    // This might be a bad idea. TODO.
    uint64_t b = (uint64_t)a;
    uint32_t len = 0;
    uint64_t most_significant;
    do ++len;
    while ((most_significant = b), b >>= 4);
    return len + (a < 0 && most_significant < 8);
}